

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_encoding.c
# Opt level: O0

int hdr_base64_decode(char *input,size_t input_len,uint8_t *output,size_t output_len)

{
  long local_40;
  size_t j;
  size_t i;
  size_t output_len_local;
  uint8_t *output_local;
  size_t input_len_local;
  char *input_local;
  
  if (((input_len < 4) || ((input_len & 3) != 0)) || ((input_len >> 2) * 3 - output_len != 0)) {
    input_local._4_4_ = -0x16;
  }
  else {
    local_40 = 0;
    for (j = 0; j < input_len; j = j + 4) {
      hdr_base64_decode_block(input + j,output + local_40);
      local_40 = local_40 + 3;
    }
    input_local._4_4_ = 0;
  }
  return input_local._4_4_;
}

Assistant:

int hdr_base64_decode(
    const char* input, size_t input_len, uint8_t* output, size_t output_len)
{
    size_t i, j;

    if (input_len < 4 ||
        (input_len & 3u) != 0 ||
        (input_len / 4) * 3 != output_len)
    {
        return -EINVAL;
    }

    for (i = 0, j = 0; i < input_len; i += 4, j += 3)
    {
        hdr_base64_decode_block(&input[i], &output[j]);
    }

    return 0;
}